

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O3

void serial_select_result(int fd,int event)

{
  uint uVar1;
  Serial *serial;
  ssize_t sVar2;
  size_t sVar3;
  int *piVar4;
  char buf [4096];
  int local_101c;
  undefined1 local_1018 [4104];
  
  local_101c = fd;
  serial = (Serial *)find234(serial_by_fd,&local_101c,serial_find_by_fd);
  if (serial != (Serial *)0x0) {
    if (event == 2) {
      serial_try_write(serial);
    }
    else if (event == 1) {
      sVar2 = read(serial->fd,local_1018,0x1000);
      uVar1 = (uint)sVar2;
      if (uVar1 == 0) {
        serial_close(serial);
        serial->finished = true;
        (*serial->seat->vt->notify_remote_exit)(serial->seat);
      }
      else if ((int)uVar1 < 0) {
        piVar4 = __errno_location();
        if (*piVar4 != 0xb) {
          serial_select_result_cold_1();
          return;
        }
      }
      else {
        sVar3 = (*serial->seat->vt->output)
                          (serial->seat,SEAT_OUTPUT_STDOUT,local_1018,(ulong)(uVar1 & 0x7fffffff));
        serial->inbufsize = sVar3;
        serial_uxsel_setup(serial);
      }
    }
  }
  return;
}

Assistant:

static void serial_select_result(int fd, int event)
{
    Serial *serial;
    char buf[4096];
    int ret;
    bool finished = false;

    serial = find234(serial_by_fd, &fd, serial_find_by_fd);

    if (!serial)
        return;                /* spurious event; keep going */

    if (event == 1) {
        ret = read(serial->fd, buf, sizeof(buf));

        if (ret == 0) {
            /*
             * Shouldn't happen on a real serial port, but I'm open
             * to the idea that there might be two-way devices we
             * can treat _like_ serial ports which can return EOF.
             */
            finished = true;
        } else if (ret < 0) {
#ifdef EAGAIN
            if (errno == EAGAIN)
                return;        /* spurious */
#endif
#ifdef EWOULDBLOCK
            if (errno == EWOULDBLOCK)
                return;        /* spurious */
#endif
            perror("read serial port");
            exit(1);
        } else if (ret > 0) {
            serial->inbufsize = seat_stdout(serial->seat, buf, ret);
            serial_uxsel_setup(serial); /* might acquire backlog and freeze */
        }
    } else if (event == 2) {
        /*
         * Attempt to send data down the pty.
         */
        serial_try_write(serial);
    }

    if (finished) {
        serial_close(serial);

        serial->finished = true;

        seat_notify_remote_exit(serial->seat);
    }
}